

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O2

sequence<acto::core::msg_t> __thiscall
acto::intrusive::mpsc_stack<acto::core::msg_t>::extract(mpsc_stack<acto::core::msg_t> *this)

{
  __pointer_type pmVar1;
  bool bVar2;
  atomic<acto::core::msg_t_*> *in_RSI;
  msg_t *top;
  
  do {
    pmVar1 = (in_RSI->_M_b)._M_p;
    top = (__pointer_type)0x0;
    if (pmVar1 == (__pointer_type)0x0) break;
    top = pmVar1;
    bVar2 = std::atomic<acto::core::msg_t_*>::compare_exchange_weak
                      (in_RSI,&top,(__pointer_type)0x0,seq_cst);
  } while (!bVar2);
  (this->head_)._M_b._M_p = top;
  return (sequence<acto::core::msg_t>)(msg_t *)this;
}

Assistant:

sequence<T> extract() noexcept {
    do {
      T* top = head_.load(std::memory_order_relaxed);

      if (top == nullptr) {
        return sequence<T>{nullptr};
      }
      if (head_.compare_exchange_weak(top, nullptr)) {
        return sequence<T>{top};
      }
    } while (true);
  }